

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

Files * __thiscall
cmInstallTargetGenerator::GetFiles
          (Files *__return_storage_ptr__,cmInstallTargetGenerator *this,string *config)

{
  string *__lhs;
  NamelinkModeType namelinkMode;
  cmGeneratorTarget *this_00;
  bool bVar1;
  size_type sVar2;
  bool bVar3;
  cmInstallType cVar4;
  cmLocalGenerator *pcVar5;
  string *psVar6;
  cmGlobalGenerator *pcVar7;
  cmMakefile *this_01;
  cmValue cVar8;
  Names *pNVar9;
  string *obj;
  _Alloc_hider __args;
  allocator<char> local_229;
  string to1;
  string from1;
  string to1_1;
  string fromDirConfig;
  string to2;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  bool local_168;
  Names targetNames;
  _Optional_payload_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  local_58;
  
  Files::Files(__return_storage_ptr__);
  cVar4 = cmGeneratorTarget::GetType(this->Target);
  switch(cVar4) {
  case cmInstallType_EXECUTABLE:
  case cmInstallType_STATIC_LIBRARY:
  case cmInstallType_SHARED_LIBRARY:
  case cmInstallType_MODULE_LIBRARY:
    __return_storage_ptr__->Type = cVar4;
    break;
  case cmInstallType_FILES:
    fromDirConfig._M_dataplus._M_p = (pointer)0x0;
    fromDirConfig._M_string_length = 0;
    fromDirConfig.field_2._M_allocated_capacity = 0;
    cmGeneratorTarget::GetTargetObjectNames
              (this->Target,config,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&fromDirConfig);
    __return_storage_ptr__->Type = cmInstallType_FILES;
    __return_storage_ptr__->NoTweak = true;
    cmGeneratorTarget::GetObjectDirectory(&targetNames.Base,this->Target,config);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->FromDir,(string *)&targetNames);
    std::__cxx11::string::~string((string *)&targetNames);
    anon_unknown.dwarf_1958685::computeInstallObjectDir(&targetNames.Base,this->Target,config);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->ToDir,(string *)&targetNames)
    ;
    std::__cxx11::string::~string((string *)&targetNames);
    sVar2 = fromDirConfig._M_string_length;
    for (__args = fromDirConfig._M_dataplus; __args._M_p != (pointer)sVar2;
        __args._M_p = __args._M_p + 0x20) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args._M_p);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&fromDirConfig);
    return __return_storage_ptr__;
  case cmInstallType_PROGRAMS:
  case cmInstallType_DIRECTORY:
  case 8:
    pcVar5 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetNames,
               "cmInstallTargetGenerator created with non-installable target.",
               (allocator<char> *)&fromDirConfig);
    cmLocalGenerator::IssueMessage(pcVar5,INTERNAL_ERROR,&targetNames.Base);
    pNVar9 = &targetNames;
    goto LAB_00473d1b;
  case cmInstallType_DIRECTORY|cmInstallType_STATIC_LIBRARY:
    __assert_fail("false && \"INTERFACE_LIBRARY targets have no installable outputs.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                  ,0xdf,
                  "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                 );
  }
  fromDirConfig._M_dataplus._M_p = (pointer)&fromDirConfig.field_2;
  fromDirConfig._M_string_length = 0;
  fromDirConfig.field_2._M_allocated_capacity =
       fromDirConfig.field_2._M_allocated_capacity & 0xffffffffffffff00;
  bVar3 = cmGeneratorTarget::NeedRelinkBeforeInstall(this->Target,config);
  if (bVar3) {
    pcVar5 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar5);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[29]>
              (&targetNames.Base,psVar6,(char (*) [29])"/CMakeFiles/CMakeRelink.dir/");
    pNVar9 = &targetNames;
    std::__cxx11::string::operator=((string *)&fromDirConfig,(string *)pNVar9);
  }
  else {
    cmGeneratorTarget::GetDirectory(&from1,this->Target,config,(uint)this->ImportLibrary);
    to1._M_dataplus._M_p._0_1_ = 0x2f;
    cmStrCat<std::__cxx11::string,char>(&targetNames.Base,&from1,(char *)&to1);
    std::__cxx11::string::operator=((string *)&fromDirConfig,(string *)&targetNames);
    std::__cxx11::string::~string((string *)&targetNames);
    pNVar9 = (Names *)&from1;
  }
  std::__cxx11::string::~string((string *)pNVar9);
  if (cVar4 == cmInstallType_EXECUTABLE) {
    if (this->NamelinkMode != NamelinkModeNone) {
      __assert_fail("this->NamelinkMode == NamelinkModeNone",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                    ,0x10b,
                    "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                   );
    }
    cmGeneratorTarget::GetExecutableNames(&targetNames,this->Target,config);
    if (this->ImportLibrary == true) {
      psVar6 = &targetNames.ImportLibrary;
      std::operator+(&from1,&fromDirConfig,psVar6);
      std::__cxx11::string::string((string *)&to1,(string *)psVar6);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&from1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,&to1);
      to1_1._M_dataplus._M_p = (pointer)&to1_1.field_2;
      to1_1._M_string_length = 0;
      to1_1.field_2._M_local_buf[0] = '\0';
      bVar3 = cmGeneratorTarget::GetImplibGNUtoMS(this->Target,config,psVar6,&to1_1,(char *)0x0);
      if (bVar3) {
        std::operator+(&to2,&fromDirConfig,&to1_1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&to2);
        std::__cxx11::string::~string((string *)&to2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,&to1_1);
      }
      __return_storage_ptr__->Type = cmInstallType_STATIC_LIBRARY;
      std::__cxx11::string::~string((string *)&to1_1);
    }
    else {
      psVar6 = &targetNames.Output;
      std::operator+(&from1,&fromDirConfig,psVar6);
      std::__cxx11::string::string((string *)&to1,(string *)psVar6);
      bVar3 = cmGeneratorTarget::IsAppBundleOnApple(this->Target);
      if (bVar3) {
        this_01 = cmTarget::GetMakefile(this->Target->Target);
        to1_1._M_dataplus._M_p = (pointer)&to1_1.field_2;
        to1_1._M_string_length = 0;
        to1_1.field_2._M_local_buf[0] = '\0';
        this_00 = this->Target;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&to2,"BUNDLE_EXTENSION",&local_229);
        cVar8 = cmGeneratorTarget::GetProperty(this_00,&to2);
        std::__cxx11::string::~string((string *)&to2);
        if (cVar8.Value == (string *)0x0) {
          std::__cxx11::string::assign((char *)&to1_1);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&to1_1);
        }
        __return_storage_ptr__->Type = cmInstallType_DIRECTORY;
        __return_storage_ptr__->UseSourcePermissions = true;
        std::__cxx11::string::append((char *)&from1);
        std::__cxx11::string::append((string *)&from1);
        std::__cxx11::string::append((char *)&to1);
        std::__cxx11::string::append((string *)&to1);
        std::__cxx11::string::append((char *)&to1);
        bVar3 = cmMakefile::PlatformIsAppleEmbedded(this_01);
        if (!bVar3) {
          std::__cxx11::string::append((char *)&to1);
        }
        std::__cxx11::string::append((string *)&to1);
LAB_00473cbc:
        std::__cxx11::string::~string((string *)&to1_1);
      }
      else {
        __lhs = &targetNames.Real;
        bVar3 = std::operator!=(__lhs,psVar6);
        if (bVar3) {
          std::operator+(&to1_1,&fromDirConfig,__lhs);
          std::__cxx11::string::string((string *)&to2,(string *)__lhs);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&to1_1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &__return_storage_ptr__->To,&to2);
          std::__cxx11::string::~string((string *)&to2);
          goto LAB_00473cbc;
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&from1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,&to1);
    }
    std::__cxx11::string::~string((string *)&to1);
    std::__cxx11::string::~string((string *)&from1);
    cmGeneratorTarget::Names::~Names(&targetNames);
  }
  else {
    cmGeneratorTarget::GetLibraryNames(&targetNames,this->Target,config);
    if (this->ImportLibrary == true) {
      bVar3 = cmMakefile::PlatformSupportsAppleTextStubs(this->Target->Makefile);
      namelinkMode = this->ImportlinkMode;
      if (!bVar3 && namelinkMode != NamelinkModeNone) {
        __assert_fail("this->Target->Makefile->PlatformSupportsAppleTextStubs() || this->ImportlinkMode == NamelinkModeNone"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                      ,0x14e,
                      "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                     );
      }
      local_178._0_8_ = 0;
      local_178._8_8_ = 0;
      local_188._0_8_ = (pointer)0x0;
      local_188._8_8_ = 0;
      local_188._0_8_ = operator_new(0x20);
      *(cmInstallTargetGenerator **)local_188._0_8_ = this;
      *(string **)(local_188._0_8_ + 8) = config;
      *(Files **)(local_188._0_8_ + 0x10) = __return_storage_ptr__;
      *(string **)(local_188._0_8_ + 0x18) = &fromDirConfig;
      local_178._8_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallTargetGenerator.cxx:336:22)>
           ::_M_invoke;
      local_178._0_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallTargetGenerator.cxx:336:22)>
           ::_M_manager;
      local_168 = true;
      anon_unknown.dwarf_1958685::computeFilesToInstall
                (__return_storage_ptr__,namelinkMode,&fromDirConfig,&targetNames.ImportOutput,
                 &targetNames.ImportLibrary,&targetNames.ImportReal,
                 (optional<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                  *)local_188);
      std::
      _Optional_payload_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      ::_M_reset((_Optional_payload_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                  *)local_188);
      __return_storage_ptr__->Type = cmInstallType_STATIC_LIBRARY;
LAB_00473be2:
      bVar3 = true;
      bVar1 = false;
    }
    else {
      bVar3 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
      if (!bVar3) {
        bVar3 = cmGeneratorTarget::IsCFBundleOnApple(this->Target);
        if (bVar3) {
          __return_storage_ptr__->Type = cmInstallType_DIRECTORY;
          __return_storage_ptr__->UseSourcePermissions = true;
          psVar6 = &targetNames.Output;
          std::__cxx11::string::find((char)psVar6,0x2f);
          std::__cxx11::string::substr((ulong)&from1,(ulong)psVar6);
          std::operator+(&to1,&fromDirConfig,&from1);
          std::__cxx11::string::string((string *)&to1_1,(string *)psVar6);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&to1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &__return_storage_ptr__->To,&to1_1);
          std::__cxx11::string::~string((string *)&to1_1);
          goto LAB_00473b13;
        }
        local_58._M_engaged = false;
        anon_unknown.dwarf_1958685::computeFilesToInstall
                  (__return_storage_ptr__,this->NamelinkMode,&fromDirConfig,&targetNames.Output,
                   &targetNames.SharedObject,&targetNames.Real,
                   (optional<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    *)&local_58);
        std::
        _Optional_payload_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
        ::_M_reset(&local_58);
        goto LAB_00473be2;
      }
      if (this->NamelinkMode != NamelinkModeOnly) {
        if (this->NamelinkMode == NamelinkModeSkip) {
          psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          std::operator+(&to1,"Target \'",psVar6);
          std::operator+(&from1,&to1,
                         "\' was changed to a FRAMEWORK sometime after install().  This may result in the wrong install DESTINATION.  Set the FRAMEWORK property earlier."
                        );
          std::__cxx11::string::~string((string *)&to1);
          pcVar7 = cmGeneratorTarget::GetGlobalGenerator(this->Target);
          cmake::IssueMessage(pcVar7->CMakeInstance,AUTHOR_WARNING,&from1,
                              &(this->super_cmInstallGenerator).Backtrace);
          std::__cxx11::string::~string((string *)&from1);
        }
        __return_storage_ptr__->Type = cmInstallType_DIRECTORY;
        __return_storage_ptr__->UseSourcePermissions = true;
        std::operator+(&from1,&fromDirConfig,&targetNames.Output);
        cmsys::SystemTools::GetFilenamePath(&to1,&from1);
        std::__cxx11::string::operator=((string *)&from1,(string *)&to1);
        std::__cxx11::string::~string((string *)&to1);
        std::__cxx11::string::string((string *)&to1,(string *)&targetNames.Real);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&from1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,&to1);
LAB_00473b13:
        std::__cxx11::string::~string((string *)&to1);
        std::__cxx11::string::~string((string *)&from1);
        goto LAB_00473be2;
      }
      bVar1 = true;
      bVar3 = false;
    }
    cmGeneratorTarget::Names::~Names(&targetNames);
    if (!bVar3) {
      std::__cxx11::string::~string((string *)&fromDirConfig);
      if (bVar1) {
        return __return_storage_ptr__;
      }
      Files::~Files(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  if ((long)(__return_storage_ptr__->From).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(__return_storage_ptr__->From).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
      (long)(__return_storage_ptr__->To).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(__return_storage_ptr__->To).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("files.From.size() == files.To.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                  ,0x19e,
                  "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                 );
  }
  pNVar9 = (Names *)&fromDirConfig;
LAB_00473d1b:
  std::__cxx11::string::~string((string *)pNVar9);
  return __return_storage_ptr__;
}

Assistant:

cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(
  std::string const& config) const
{
  Files files;

  cmStateEnums::TargetType targetType = this->Target->GetType();
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      files.Type = cmInstallType_EXECUTABLE;
      break;
    case cmStateEnums::STATIC_LIBRARY:
      files.Type = cmInstallType_STATIC_LIBRARY;
      break;
    case cmStateEnums::SHARED_LIBRARY:
      files.Type = cmInstallType_SHARED_LIBRARY;
      break;
    case cmStateEnums::MODULE_LIBRARY:
      files.Type = cmInstallType_MODULE_LIBRARY;
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      // Not reachable. We never create a cmInstallTargetGenerator for
      // an INTERFACE_LIBRARY.
      assert(false &&
             "INTERFACE_LIBRARY targets have no installable outputs.");
      break;

    case cmStateEnums::OBJECT_LIBRARY: {
      // Compute all the object files inside this target
      std::vector<std::string> objects;
      this->Target->GetTargetObjectNames(config, objects);

      files.Type = cmInstallType_FILES;
      files.NoTweak = true;
      files.FromDir = this->Target->GetObjectDirectory(config);
      files.ToDir = computeInstallObjectDir(this->Target, config);
      for (std::string& obj : objects) {
        files.From.emplace_back(obj);
        files.To.emplace_back(std::move(obj));
      }
      return files;
    }

    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::UNKNOWN_LIBRARY:
      this->Target->GetLocalGenerator()->IssueMessage(
        MessageType::INTERNAL_ERROR,
        "cmInstallTargetGenerator created with non-installable target.");
      return files;
  }

  // Compute the build tree directory from which to copy the target.
  std::string fromDirConfig;
  if (this->Target->NeedRelinkBeforeInstall(config)) {
    fromDirConfig =
      cmStrCat(this->Target->GetLocalGenerator()->GetCurrentBinaryDirectory(),
               "/CMakeFiles/CMakeRelink.dir/");
  } else {
    cmStateEnums::ArtifactType artifact = this->ImportLibrary
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    fromDirConfig =
      cmStrCat(this->Target->GetDirectory(config, artifact), '/');
  }

  if (targetType == cmStateEnums::EXECUTABLE) {
    // There is a bug in cmInstallCommand if this fails.
    assert(this->NamelinkMode == NamelinkModeNone);

    cmGeneratorTarget::Names targetNames =
      this->Target->GetExecutableNames(config);
    if (this->ImportLibrary) {
      std::string from1 = fromDirConfig + targetNames.ImportLibrary;
      std::string to1 = targetNames.ImportLibrary;
      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
      std::string targetNameImportLib;
      if (this->Target->GetImplibGNUtoMS(config, targetNames.ImportLibrary,
                                         targetNameImportLib)) {
        files.From.emplace_back(fromDirConfig + targetNameImportLib);
        files.To.emplace_back(targetNameImportLib);
      }

      // An import library looks like a static library.
      files.Type = cmInstallType_STATIC_LIBRARY;
    } else {
      std::string from1 = fromDirConfig + targetNames.Output;
      std::string to1 = targetNames.Output;

      // Handle OSX Bundles.
      if (this->Target->IsAppBundleOnApple()) {
        cmMakefile const* mf = this->Target->Target->GetMakefile();

        // Get App Bundle Extension
        std::string ext;
        if (cmValue p = this->Target->GetProperty("BUNDLE_EXTENSION")) {
          ext = *p;
        } else {
          ext = "app";
        }

        // Install the whole app bundle directory.
        files.Type = cmInstallType_DIRECTORY;
        files.UseSourcePermissions = true;
        from1 += ".";
        from1 += ext;

        // Tweaks apply to the binary inside the bundle.
        to1 += ".";
        to1 += ext;
        to1 += "/";
        if (!mf->PlatformIsAppleEmbedded()) {
          to1 += "Contents/MacOS/";
        }
        to1 += targetNames.Output;
      } else {
        // Tweaks apply to the real file, so list it first.
        if (targetNames.Real != targetNames.Output) {
          std::string from2 = fromDirConfig + targetNames.Real;
          std::string to2 = targetNames.Real;
          files.From.emplace_back(std::move(from2));
          files.To.emplace_back(std::move(to2));
        }
      }

      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
    }
  } else {
    cmGeneratorTarget::Names targetNames =
      this->Target->GetLibraryNames(config);
    if (this->ImportLibrary) {
      // There is a bug in cmInstallCommand if this fails.
      assert(this->Target->Makefile->PlatformSupportsAppleTextStubs() ||
             this->ImportlinkMode == NamelinkModeNone);

      auto GNUToMS = [this, &config, &files,
                      &fromDirConfig](const std::string& lib) {
        std::string importLib;
        if (this->Target->GetImplibGNUtoMS(config, lib, importLib)) {
          files.From.emplace_back(fromDirConfig + importLib);
          files.To.emplace_back(importLib);
        }
      };

      computeFilesToInstall(
        files, this->ImportlinkMode, fromDirConfig, targetNames.ImportOutput,
        targetNames.ImportLibrary, targetNames.ImportReal, GNUToMS);

      // An import library looks like a static library.
      files.Type = cmInstallType_STATIC_LIBRARY;
    } else if (this->Target->IsFrameworkOnApple()) {
      // FIXME: In principle we should be able to
      //   assert(this->NamelinkMode == NamelinkModeNone);
      // but since the current install() command implementation checks
      // the FRAMEWORK property immediately instead of delaying until
      // generate time, it is possible for project code to set the
      // property after calling install().  In such a case, the install()
      // command will use the LIBRARY code path and create two install
      // generators, one for the namelink component (NamelinkModeOnly)
      // and one for the primary artifact component (NamelinkModeSkip).
      // Historically this was not diagnosed and resulted in silent
      // installation of a framework to the LIBRARY destination.
      // Retain that behavior and warn about the case.
      switch (this->NamelinkMode) {
        case NamelinkModeNone:
          // Normal case.
          break;
        case NamelinkModeOnly:
          // Assume the NamelinkModeSkip instance will warn and install.
          return files;
        case NamelinkModeSkip: {
          std::string e = "Target '" + this->Target->GetName() +
            "' was changed to a FRAMEWORK sometime after install().  "
            "This may result in the wrong install DESTINATION.  "
            "Set the FRAMEWORK property earlier.";
          this->Target->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
            MessageType::AUTHOR_WARNING, e, this->GetBacktrace());
        } break;
      }

      // Install the whole framework directory.
      files.Type = cmInstallType_DIRECTORY;
      files.UseSourcePermissions = true;

      std::string from1 = fromDirConfig + targetNames.Output;
      from1 = cmSystemTools::GetFilenamePath(from1);

      // Tweaks apply to the binary inside the bundle.
      std::string to1 = targetNames.Real;

      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
    } else if (this->Target->IsCFBundleOnApple()) {
      // Install the whole app bundle directory.
      files.Type = cmInstallType_DIRECTORY;
      files.UseSourcePermissions = true;

      std::string targetNameBase =
        targetNames.Output.substr(0, targetNames.Output.find('/'));

      std::string from1 = fromDirConfig + targetNameBase;
      std::string to1 = targetNames.Output;

      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
    } else {
      computeFilesToInstall(files, this->NamelinkMode, fromDirConfig,
                            targetNames.Output, targetNames.SharedObject,
                            targetNames.Real);
    }
  }

  // If this fails the above code is buggy.
  assert(files.From.size() == files.To.size());

  return files;
}